

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

optional<int>
slang::ast::bindArrayIndexSetter
          (ASTContext *context,Expression *keyExpr,Type *elementType,ExpressionSyntax *valueSyntax,
          SmallMap<int,_const_slang::ast::Expression_*,_8UL,_ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>
          *indexMap,
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
          *indexSetters)

{
  SourceRange *pSVar1;
  optional<int> this;
  bool bVar2;
  int *piVar3;
  Diagnostic *pDVar4;
  pair<int,_const_slang::ast::Expression_*> *ppVar5;
  pair<ska::detailv3::sherwood_v3_table<std::pair<int,_const_slang::ast::Expression_*>,_int,_std::hash<int>,_ska::detailv3::KeyOrValueHasher<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::hash<int>_>,_std::equal_to<int>,_ska::detailv3::KeyOrValueEquality<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::equal_to<int>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<int,_const_slang::ast::Expression_*>_>,_bool>
  pVar6;
  Expression *local_118;
  Expression *local_110;
  undefined1 local_108 [24];
  SourceLocation local_f0;
  SourceLocation local_e8;
  DiagCode local_dc;
  SourceLocation local_d8;
  SourceLocation local_d0;
  undefined4 local_c4;
  Diagnostic *local_c0;
  Diagnostic *diag;
  type_conflict2 *inserted;
  type *it;
  undefined1 local_a0;
  Expression *local_98;
  pair<ska::detailv3::sherwood_v3_table<std::pair<int,_const_slang::ast::Expression_*>,_int,_std::hash<int>,_ska::detailv3::KeyOrValueHasher<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::hash<int>_>,_std::equal_to<int>,_ska::detailv3::KeyOrValueEquality<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::equal_to<int>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<int,_const_slang::ast::Expression_*>_>,_bool>
  local_90;
  bitmask<slang::ast::ASTFlags> local_78;
  Token local_70;
  SourceLocation local_60;
  Expression *local_58;
  Expression *expr;
  _Optional_payload_base<int> local_48;
  optional<int> index;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
  *indexSetters_local;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>
  *indexMap_local;
  ExpressionSyntax *valueSyntax_local;
  Type *elementType_local;
  Expression *keyExpr_local;
  ASTContext *context_local;
  
  index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)indexSetters;
  local_48 = (_Optional_payload_base<int>)ASTContext::evalInteger(context,keyExpr);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_48);
  if (bVar2) {
    local_70 = slang::syntax::SyntaxNode::getFirstToken(&valueSyntax->super_SyntaxNode);
    local_60 = parsing::Token::location(&local_70);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_78,None);
    local_58 = Expression::bindRValue(elementType,valueSyntax,local_60,context,local_78);
    bVar2 = Expression::bad(local_58);
    if (bVar2) {
      std::optional<int>::optional((optional<int> *)&context_local);
    }
    else {
      piVar3 = std::optional<int>::operator*((optional<int> *)&local_48);
      local_98 = local_58;
      pVar6 = ska::detailv3::
              sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>
              ::emplace<int&,slang::ast::Expression_const*>
                        ((sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>
                          *)&indexMap->
                             super_flat_hash_map<int,_const_slang::ast::Expression_*,_std::hash<int>,_std::equal_to<int>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>
                         ,piVar3,&local_98);
      it = (type *)pVar6.first.current;
      local_a0 = pVar6.second;
      local_90.first.current = (EntryPointer)it;
      local_90.second = (bool)local_a0;
      inserted = (type_conflict2 *)
                 std::
                 get<0ul,ska::detailv3::sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>::templated_iterator<std::pair<int,slang::ast::Expression_const*>>,bool>
                           (&local_90);
      diag = (Diagnostic *)
             std::
             get<1ul,ska::detailv3::sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>::templated_iterator<std::pair<int,slang::ast::Expression_const*>>,bool>
                       (&local_90);
      this = index;
      if (((ulong)(diag->args).
                  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                  ._M_impl.super__Vector_impl_data._M_start & 1) == 0) {
        local_c4 = 0x110007;
        local_d8 = (keyExpr->sourceRange).startLoc;
        local_d0 = (keyExpr->sourceRange).endLoc;
        pDVar4 = ASTContext::addDiag(context,(DiagCode)0x110007,keyExpr->sourceRange);
        local_c0 = pDVar4;
        piVar3 = std::optional<int>::operator*((optional<int> *)&local_48);
        Diagnostic::operator<<(pDVar4,*piVar3);
        pDVar4 = local_c0;
        local_dc.subsystem = General;
        local_dc.code = 8;
        ppVar5 = ska::detailv3::
                 sherwood_v3_table<std::pair<int,_const_slang::ast::Expression_*>,_int,_std::hash<int>,_ska::detailv3::KeyOrValueHasher<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::hash<int>_>,_std::equal_to<int>,_ska::detailv3::KeyOrValueEquality<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::equal_to<int>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>
                 ::templated_iterator<std::pair<int,_const_slang::ast::Expression_*>_>::operator->
                           ((templated_iterator<std::pair<int,_const_slang::ast::Expression_*>_> *)
                            inserted);
        pSVar1 = &ppVar5->second->sourceRange;
        local_f0 = pSVar1->startLoc;
        local_e8 = (ppVar5->second->sourceRange).endLoc;
        Diagnostic::addNote(pDVar4,local_dc,*pSVar1);
        std::optional<int>::optional((optional<int> *)&context_local);
      }
      else {
        local_110 = keyExpr;
        not_null<slang::ast::Expression_const*>::not_null<slang::ast::Expression_const*,void>
                  ((not_null<slang::ast::Expression_const*> *)local_108,&local_110);
        local_118 = local_58;
        not_null<slang::ast::Expression_const*>::not_null<slang::ast::Expression_const*,void>
                  ((not_null<slang::ast::Expression_const*> *)(local_108 + 8),&local_118);
        SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::push_back
                  ((SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                    *)this.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>,(IndexSetter *)local_108);
        piVar3 = std::optional<int>::operator*((optional<int> *)&local_48);
        std::optional<int>::optional<int_&,_true>((optional<int> *)&context_local,piVar3);
      }
    }
  }
  else {
    std::optional<int>::optional((optional<int> *)&context_local);
  }
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)context_local;
}

Assistant:

static std::optional<int32_t> bindArrayIndexSetter(
    const ASTContext& context, const Expression& keyExpr, const Type& elementType,
    const ExpressionSyntax& valueSyntax, SmallMap<int32_t, const Expression*, 8>& indexMap,
    SmallVectorBase<StructuredAssignmentPatternExpression::IndexSetter>& indexSetters) {

    std::optional<int32_t> index = context.evalInteger(keyExpr);
    if (!index)
        return std::nullopt;

    auto& expr = Expression::bindRValue(elementType, valueSyntax,
                                        valueSyntax.getFirstToken().location(), context);
    if (expr.bad())
        return std::nullopt;

    auto [it, inserted] = indexMap.emplace(*index, &expr);
    if (!inserted) {
        auto& diag = context.addDiag(diag::AssignmentPatternKeyDupValue, keyExpr.sourceRange);
        diag << *index;
        diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
        return std::nullopt;
    }

    indexSetters.push_back({&keyExpr, &expr});
    return *index;
}